

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O0

int genaUnSubscribe(UpnpClient_Handle client_handle,UpnpString *in_sid)

{
  Upnp_Handle_Type UVar1;
  UpnpString *url;
  UpnpString *sid;
  undefined1 local_228 [8];
  http_parser_t response;
  GenlibClientSubscription *sub_copy;
  Handle_Info *handle_info;
  GenlibClientSubscription *pGStack_20;
  int return_code;
  GenlibClientSubscription *sub;
  UpnpString *in_sid_local;
  UpnpClient_Handle client_handle_local;
  
  pGStack_20 = (GenlibClientSubscription *)0x0;
  handle_info._4_4_ = 0;
  sub = (GenlibClientSubscription *)in_sid;
  in_sid_local._4_4_ = client_handle;
  response.scanner._16_8_ = GenlibClientSubscription_new();
  HandleLock(".upnp/src/gena/gena_ctrlpt.c",0x20f);
  UVar1 = GetHandleInfo(in_sid_local._4_4_,(Handle_Info **)&sub_copy);
  if (UVar1 == HND_CLIENT) {
    pGStack_20 = GetClientSubClientSID
                           ((GenlibClientSubscription *)sub_copy[0x10].m_SID,(UpnpString *)sub);
    if (pGStack_20 == (GenlibClientSubscription *)0x0) {
      HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x217);
      handle_info._4_4_ = -0x6d;
    }
    else {
      GenlibClientSubscription_assign
                ((GenlibClientSubscription *)response.scanner._16_8_,pGStack_20);
      HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x21c);
      url = GenlibClientSubscription_get_EventURL
                      ((GenlibClientSubscription *)response.scanner._16_8_);
      sid = GenlibClientSubscription_get_ActualSID
                      ((GenlibClientSubscription *)response.scanner._16_8_);
      handle_info._4_4_ = gena_unsubscribe(url,sid,(http_parser_t *)local_228);
      if (handle_info._4_4_ == 0) {
        httpmsg_destroy((http_message_t *)local_228);
      }
      free_client_subscription((GenlibClientSubscription *)response.scanner._16_8_);
      HandleLock(".upnp/src/gena/gena_ctrlpt.c",0x227);
      UVar1 = GetHandleInfo(in_sid_local._4_4_,(Handle_Info **)&sub_copy);
      if (UVar1 == HND_CLIENT) {
        RemoveClientSubClientSID
                  ((GenlibClientSubscription **)&sub_copy[0x10].m_SID,(UpnpString *)sub);
        HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x22e);
      }
      else {
        HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x229);
        handle_info._4_4_ = -100;
      }
    }
  }
  else {
    HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x211);
    handle_info._4_4_ = -100;
  }
  GenlibClientSubscription_delete((GenlibClientSubscription *)response.scanner._16_8_);
  return handle_info._4_4_;
}

Assistant:

int genaUnSubscribe(UpnpClient_Handle client_handle, const UpnpString *in_sid)
{
	GenlibClientSubscription *sub = NULL;
	int return_code = GENA_SUCCESS;
	struct Handle_Info *handle_info;
	GenlibClientSubscription *sub_copy = GenlibClientSubscription_new();
	http_parser_t response;

	/* validate handle and sid */
	HandleLock(__FILE__, __LINE__);
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		HandleUnlock(__FILE__, __LINE__);
		return_code = GENA_E_BAD_HANDLE;
		goto exit_function;
	}
	sub = GetClientSubClientSID(handle_info->ClientSubList, in_sid);
	if (sub == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return_code = GENA_E_BAD_SID;
		goto exit_function;
	}
	GenlibClientSubscription_assign(sub_copy, sub);
	HandleUnlock(__FILE__, __LINE__);

	return_code = gena_unsubscribe(
		GenlibClientSubscription_get_EventURL(sub_copy),
		GenlibClientSubscription_get_ActualSID(sub_copy),
		&response);
	if (return_code == 0) {
		httpmsg_destroy(&response.msg);
	}
	free_client_subscription(sub_copy);

	HandleLock(__FILE__, __LINE__);
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		HandleUnlock(__FILE__, __LINE__);
		return_code = GENA_E_BAD_HANDLE;
		goto exit_function;
	}
	RemoveClientSubClientSID(&handle_info->ClientSubList, in_sid);
	HandleUnlock(__FILE__, __LINE__);

exit_function:
	GenlibClientSubscription_delete(sub_copy);
	return return_code;
}